

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O1

ssize_t __thiscall kj::FdOutputStream::write(FdOutputStream *this,int __fd,void *__buf,size_t __n)

{
  int code;
  ssize_t in_RAX;
  undefined4 in_register_00000034;
  void *__buf_00;
  ssize_t n;
  Fault f_1;
  Fault f;
  
  __buf_00 = (void *)CONCAT44(in_register_00000034,__fd);
  if (__buf != (void *)0x0) {
LAB_001d3708:
    do {
      n = ::write(this->fd,__buf_00,(size_t)__buf);
      if (n < 0) {
        code = _::Debug::getOsErrorNumber(false);
        if (code == -1) goto LAB_001d3708;
      }
      else {
        code = 0;
      }
      if (code != 0) {
        _::Debug::Fault::Fault<int,int&>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
                   ,0x17f,code,"n = miniposix::write(fd, pos, size)","fd",&this->fd);
        _::Debug::Fault::fatal(&f);
      }
      if (n < 1) {
        f.exception = (Exception *)&n;
        _::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<long&,int>&,char_const(&)[23]>
                  (&f_1,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
                   ,0x181,FAILED,"n > 0","_kjCondition,\"write() returned zero.\"",
                   (DebugComparison<long_&,_int> *)&f,(char (*) [23])"write() returned zero.");
        _::Debug::Fault::fatal(&f_1);
      }
      __buf_00 = (void *)((long)__buf_00 + n);
      __buf = (void *)((long)__buf - n);
      in_RAX = n;
      f.exception = (Exception *)&n;
    } while (__buf != (void *)0x0);
  }
  return in_RAX;
}

Assistant:

void FdOutputStream::write(ArrayPtr<const byte> data) {
  auto size = data.size();
  auto pos = data.begin();

  while (size > 0) {
    miniposix::ssize_t n;
#if _WIN32 || __APPLE__
    // Windows and Mac suffer from bugs in which they will fail if given more than INT_MAX bytes
    // in a single write operation. We can just clamp the size since the loop will then handle
    // writing the rest. I don't know why these platforms don't just do this themselves.
    KJ_SYSCALL(n = miniposix::write(fd, pos, kj::min(size, WRITE_CLAMP_SIZE)), fd);
#else
    KJ_SYSCALL(n = miniposix::write(fd, pos, size), fd);
#endif
    KJ_ASSERT(n > 0, "write() returned zero.");
    pos += n;
    size -= n;
  }
}